

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O2

void __thiscall OpenMD::Sticky::initialize(Sticky *this)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  value_type_conflict1 local_24;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->Stypes)._M_t);
  piVar2 = (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::
  vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
  ::clear(&this->MixingMap);
  this->nSticky_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->Stids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,&local_24);
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar3 = AtomType::isSticky(*(AtomType **)(p_Var4 + 1));
    if (bVar3) {
      this->nSticky_ = this->nSticky_ + 1;
    }
  }
  std::
  vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nSticky_);
  for (p_Var4 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar3 = AtomType::isSticky(*(AtomType **)(p_Var4 + 1));
    if (bVar3) {
      addType(this,*(AtomType **)(p_Var4 + 1));
    }
  }
  this->initialized_ = true;
  return;
}

Assistant:

void Sticky::initialize() {
    Stypes.clear();
    Stids.clear();
    MixingMap.clear();
    nSticky_ = 0;

    Stids.resize(forceField_->getNAtomType(), -1);

    // Sticky handles all of the Sticky-Sticky interactions

    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSticky()) nSticky_++;
    }

    MixingMap.resize(nSticky_);

    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isSticky()) addType(*at);
    }

    initialized_ = true;
  }